

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O3

bool __thiscall
binlog::SessionWriter::addEvent<char_const*&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,char **args)

{
  ulong minQueueCapacity;
  QueueWriter *this_00;
  char **ppcVar1;
  Queue *pQVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  
  pcVar5 = "{null}";
  if (*args != (char *)0x0) {
    pcVar5 = *args;
  }
  sVar3 = strlen(pcVar5);
  minQueueCapacity = sVar3 + 0x18;
  this_00 = &this->_qw;
  if (((((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity) &&
       (sVar4 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar4 < minQueueCapacity)) &&
      (replaceChannel(this,minQueueCapacity),
      (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity)) &&
     (sVar4 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar4 < minQueueCapacity)) {
    return false;
  }
  *(int *)(this->_qw)._writePos = (int)sVar3 + 0x14;
  pcVar5 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar5 + 4;
  *(uint64_t *)(pcVar5 + 4) = eventSourceId;
  pcVar5 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar5 + 8;
  *(uint64_t *)(pcVar5 + 8) = clock;
  ppcVar1 = &(this->_qw)._writePos;
  *ppcVar1 = *ppcVar1 + 8;
  mserialize::CustomSerializer<const_char_*,_void>::serialize<binlog::detail::QueueWriter>
            (*args,this_00);
  pQVar2 = (this->_qw)._queue;
  (pQVar2->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(this->_qw)._writePos - (long)pQVar2->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}